

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  byte bVar1;
  int iVar2;
  xmlBufPtr buf;
  xmlChar *pxVar3;
  xmlEntityPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr elem;
  _xmlNode *p_Var8;
  xmlNodePtr pxVar9;
  byte *pbVar10;
  long lVar11;
  int code;
  byte *pbVar12;
  bool bVar13;
  xmlChar buffer [10];
  xmlNodePtr local_50;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    pxVar5 = (xmlNodePtr)0x0;
  }
  else {
    pxVar5 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      local_50 = (xmlNodePtr)0x0;
      elem = (xmlNodePtr)0x0;
      do {
        do {
          while( true ) {
            pbVar10 = value + 2;
            pbVar12 = value;
            while( true ) {
              pxVar9 = elem;
              if (*pbVar12 == 0) {
                if ((pbVar12 != value) || (elem == (xmlNodePtr)0x0)) {
                  xmlBufAdd(buf,value,(int)pbVar12 - (int)value);
                }
                iVar2 = xmlBufIsEmpty(buf);
                if (iVar2 == 0) {
                  pxVar3 = (xmlChar *)0x0;
                  pxVar5 = xmlNewDocText(doc,(xmlChar *)0x0);
                  if (pxVar5 == (xmlNodePtr)0x0) goto LAB_0017eb1b;
                  pxVar3 = xmlBufDetach(buf);
                  pxVar5->content = pxVar3;
                  if (local_50 == (xmlNodePtr)0x0) {
                    pxVar3 = (xmlChar *)0x0;
                    pxVar9 = (xmlNodePtr)0x0;
                    goto LAB_0017eb20;
                  }
                  xmlAddNextSibling(local_50,pxVar5);
                }
                pxVar3 = (xmlChar *)0x0;
                pxVar9 = (xmlNodePtr)0x0;
                pxVar5 = elem;
                goto LAB_0017eb20;
              }
              if (*pbVar12 == 0x26) break;
              pbVar12 = pbVar12 + 1;
              pbVar10 = pbVar10 + 1;
            }
            if ((pbVar12 != value) &&
               (iVar2 = xmlBufAdd(buf,value,(int)pbVar12 - (int)value), iVar2 != 0))
            goto LAB_0017eb18;
            bVar1 = pbVar12[1];
            if (bVar1 == 0x23) break;
            lVar11 = 0;
            while( true ) {
              if (bVar1 == 0) {
                xmlTreeErr(0x516,(xmlNodePtr)doc,(char *)(pbVar12 + 1));
                goto LAB_0017eb18;
              }
              if (bVar1 == 0x3b) break;
              bVar1 = *pbVar10;
              pbVar10 = pbVar10 + 1;
              lVar11 = lVar11 + 1;
            }
            value = pbVar10;
            if (lVar11 != 0) {
              pxVar3 = xmlStrndup(pbVar12 + 1,(int)lVar11);
              pxVar4 = xmlGetDocEntity(doc,pxVar3);
              if ((pxVar4 == (xmlEntityPtr)0x0) || (pxVar4->etype != XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar2 = xmlBufIsEmpty(buf);
                pxVar5 = elem;
                pxVar7 = local_50;
                if (iVar2 == 0) {
                  pxVar5 = xmlNewDocText(doc,(xmlChar *)0x0);
                  if (pxVar5 == (xmlNodePtr)0x0) goto LAB_0017eb1b;
                  pxVar6 = xmlBufDetach(buf);
                  pxVar5->content = pxVar6;
                  pxVar7 = pxVar5;
                  if (local_50 != (xmlNodePtr)0x0) {
                    pxVar7 = xmlAddNextSibling(local_50,pxVar5);
                    pxVar5 = elem;
                  }
                }
                local_50 = pxVar7;
                elem = xmlNewReference(doc,pxVar3);
                pxVar9 = pxVar5;
                if (elem == (xmlNodePtr)0x0) goto LAB_0017eb1b;
                if ((pxVar4 != (xmlEntityPtr)0x0) && (pxVar4->children == (_xmlNode *)0x0)) {
                  pxVar4->children = (_xmlNode *)0xffffffffffffffff;
                  p_Var8 = xmlStringGetNodeList(doc,elem->content);
                  pxVar4->children = p_Var8;
                  pxVar4->owner = 1;
                  for (; p_Var8 != (_xmlNode *)0x0; p_Var8 = p_Var8->next) {
                    p_Var8->parent = (_xmlNode *)pxVar4;
                    pxVar4->last = p_Var8;
                  }
                }
                pxVar7 = elem;
                if (local_50 != (xmlNodePtr)0x0) {
                  pxVar7 = xmlAddNextSibling(local_50,elem);
                  elem = pxVar5;
                }
              }
              else {
                iVar2 = xmlBufCat(buf,pxVar4->content);
                pxVar7 = local_50;
                if (iVar2 != 0) goto LAB_0017eb1b;
              }
              (*xmlFree)(pxVar3);
              local_50 = pxVar7;
            }
          }
          bVar1 = pbVar12[2];
          if (bVar1 == 0x78) {
            pbVar12 = pbVar12 + 3;
            iVar2 = 0;
            while( true ) {
              bVar1 = *pbVar12;
              bVar13 = bVar1 == 0x3b;
              if (bVar13) break;
              if (9 < (byte)(bVar1 - 0x30)) {
                if ((byte)(bVar1 + 0x9f) < 6) {
                  iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x57;
                  goto LAB_0017e8bf;
                }
                if ((byte)(bVar1 + 0xbf) < 6) {
                  iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x37;
                  goto LAB_0017e8bf;
                }
                code = 0x514;
LAB_0017e8fb:
                iVar2 = 0;
                xmlTreeErr(code,(xmlNodePtr)doc,(char *)0x0);
                break;
              }
              iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x30;
LAB_0017e8bf:
              pbVar12 = pbVar12 + 1;
            }
          }
          else {
            pbVar12 = pbVar12 + 2;
            iVar2 = 0;
            while (bVar13 = bVar1 == 0x3b, !bVar13) {
              if (9 < (byte)(bVar1 - 0x30)) {
                code = 0x515;
                goto LAB_0017e8fb;
              }
              iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
              pbVar10 = pbVar12 + 1;
              pbVar12 = pbVar12 + 1;
              bVar1 = *pbVar10;
            }
          }
          value = pbVar12 + bVar13;
        } while (iVar2 == 0);
        iVar2 = xmlCopyCharMultiByte(local_3a,iVar2);
        local_3a[iVar2] = '\0';
        iVar2 = xmlBufCat(buf,local_3a);
      } while (iVar2 == 0);
LAB_0017eb18:
      pxVar3 = (xmlChar *)0x0;
LAB_0017eb1b:
      pxVar5 = (xmlNodePtr)0x0;
LAB_0017eb20:
      xmlBufFree(buf);
      if (pxVar3 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar3);
      }
      if (pxVar9 != (xmlNodePtr)0x0) {
        xmlFreeNodeList(pxVar9);
      }
    }
  }
  return pxVar5;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
                            if (node == NULL)
                                goto out;
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = head = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL)
			    goto out;
			if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = head = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (head == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL)
            goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

    ret = head;
    head = NULL;

out:
    xmlBufFree(buf);
    if (val != NULL) xmlFree(val);
    if (head != NULL) xmlFreeNodeList(head);
    return(ret);
}